

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_cmp.cc
# Opt level: O0

X509 * X509_find_by_issuer_and_serial(stack_st_X509 *sk,X509_NAME *name,ASN1_INTEGER *serial)

{
  int iVar1;
  X509 *pXVar2;
  X509 *a;
  ASN1_INTEGER *x;
  X509_NAME *a_00;
  X509 *x509;
  size_t i;
  ASN1_INTEGER *serial_local;
  X509_NAME *name_local;
  stack_st_X509 *sk_local;
  
  if ((serial->type == 2) || (serial->type == 0x102)) {
    for (x509 = (X509 *)0x0; pXVar2 = (X509 *)sk_X509_num((stack_st_X509 *)sk), x509 < pXVar2;
        x509 = (X509 *)((long)&x509->cert_info + 1)) {
      a = (X509 *)sk_X509_value((stack_st_X509 *)sk,(size_t)x509);
      x = X509_get0_serialNumber((X509 *)a);
      iVar1 = ASN1_INTEGER_cmp((ASN1_INTEGER *)x,serial);
      if (iVar1 == 0) {
        a_00 = X509_get_issuer_name(a);
        iVar1 = X509_NAME_cmp(a_00,name);
        if (iVar1 == 0) {
          return a;
        }
      }
    }
  }
  return (X509 *)0x0;
}

Assistant:

X509 *X509_find_by_issuer_and_serial(const STACK_OF(X509) *sk, X509_NAME *name,
                                     const ASN1_INTEGER *serial) {
  if (serial->type != V_ASN1_INTEGER && serial->type != V_ASN1_NEG_INTEGER) {
    return NULL;
  }

  for (size_t i = 0; i < sk_X509_num(sk); i++) {
    X509 *x509 = sk_X509_value(sk, i);
    if (ASN1_INTEGER_cmp(X509_get0_serialNumber(x509), serial) == 0 &&
        X509_NAME_cmp(X509_get_issuer_name(x509), name) == 0) {
      return x509;
    }
  }
  return NULL;
}